

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radio.cpp
# Opt level: O3

int __thiscall zmq::radio_session_t::push_msg(radio_session_t *this,msg_t *msg_)

{
  byte bVar1;
  int iVar2;
  int *piVar3;
  size_t sVar4;
  int iVar5;
  char *group_;
  msg_t join_leave_msg;
  anon_union_64_6_15276b06_for__u local_60;
  
  bVar1 = msg_t::flags(msg_);
  if ((bVar1 & 2) != 0) {
    piVar3 = (int *)msg_t::data(msg_);
    sVar4 = msg_t::size(msg_);
    if (4 < sVar4) {
      if ((char)piVar3[1] == 'N' && *piVar3 == 0x494f4a04) {
        iVar5 = (int)sVar4 + -5;
        group_ = (char *)((long)piVar3 + 5);
        iVar2 = msg_t::init_join((msg_t *)&local_60.base);
      }
      else {
        if ((sVar4 == 5) || ((short)piVar3[1] != 0x4556 || *piVar3 != 0x41454c05))
        goto LAB_001e67be;
        iVar5 = (int)sVar4 + -6;
        group_ = (char *)((long)piVar3 + 6);
        iVar2 = msg_t::init_leave((msg_t *)&local_60.base);
      }
      if (iVar2 != 0) {
        push_msg();
      }
      iVar2 = msg_t::set_group((msg_t *)&local_60.base,group_,(long)iVar5);
      iVar5 = (int)group_;
      if (iVar2 != 0) {
        push_msg();
      }
      iVar2 = msg_t::close(msg_,iVar5);
      if (iVar2 != 0) {
        push_msg();
      }
      *(undefined8 *)((long)&msg_->_u + 0x30) = local_60._48_8_;
      *(undefined8 *)((long)&msg_->_u + 0x38) = local_60._56_8_;
      *(undefined8 *)((long)&msg_->_u + 0x20) = local_60._32_8_;
      *(undefined8 *)((long)&msg_->_u + 0x28) = local_60._40_8_;
      (msg_->_u).cmsg.size = local_60.cmsg.size;
      *(undefined8 *)((long)&msg_->_u + 0x18) = local_60._24_8_;
      (msg_->_u).base.metadata = local_60.base.metadata;
      (msg_->_u).lmsg.content = local_60.lmsg.content;
      iVar2 = session_base_t::push_msg(&this->super_session_base_t,msg_);
      return iVar2;
    }
  }
LAB_001e67be:
  iVar2 = session_base_t::push_msg(&this->super_session_base_t,msg_);
  return iVar2;
}

Assistant:

int zmq::radio_session_t::push_msg (msg_t *msg_)
{
    if (msg_->flags () & msg_t::command) {
        char *command_data = static_cast<char *> (msg_->data ());
        const size_t data_size = msg_->size ();

        int group_length;
        const char *group;

        msg_t join_leave_msg;
        int rc;

        //  Set the msg type to either JOIN or LEAVE
        if (data_size >= 5 && memcmp (command_data, "\4JOIN", 5) == 0) {
            group_length = static_cast<int> (data_size) - 5;
            group = command_data + 5;
            rc = join_leave_msg.init_join ();
        } else if (data_size >= 6 && memcmp (command_data, "\5LEAVE", 6) == 0) {
            group_length = static_cast<int> (data_size) - 6;
            group = command_data + 6;
            rc = join_leave_msg.init_leave ();
        }
        //  If it is not a JOIN or LEAVE just push the message
        else
            return session_base_t::push_msg (msg_);

        errno_assert (rc == 0);

        //  Set the group
        rc = join_leave_msg.set_group (group, group_length);
        errno_assert (rc == 0);

        //  Close the current command
        rc = msg_->close ();
        errno_assert (rc == 0);

        //  Push the join or leave command
        *msg_ = join_leave_msg;
        return session_base_t::push_msg (msg_);
    }
    return session_base_t::push_msg (msg_);
}